

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O1

void __thiscall TestSchema::readRawData(TestSchema *this)

{
  ostream os;
  ifstream in;
  InputBuffer local_3e0;
  Parser<avro::ReaderImpl<avro::NullValidator>_> local_3d0;
  undefined1 local_378 [64];
  locale local_338 [8];
  OutputBuffer local_330;
  undefined8 local_320 [33];
  undefined1 local_218 [16];
  streambuf local_208 [504];
  
  std::ifstream::ifstream(local_218,"test.avro",_S_in);
  avro::ostream::ostream((ostream *)local_378);
  std::ostream::operator<<(local_378,local_208);
  avro::InputBuffer::InputBuffer(&local_3e0,&local_330);
  local_3d0.reader_.reader_.bufferImpl_.px = local_3e0.pimpl_.px;
  local_3d0.reader_.reader_.bufferImpl_.pn.pi_ = local_3e0.pimpl_.pn.pi_;
  if (local_3e0.pimpl_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_3e0.pimpl_.pn.pi_)->use_count_ = (local_3e0.pimpl_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_3d0.reader_.reader_.iter_._M_cur =
       ((local_3e0.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_3d0.reader_.reader_.iter_._M_first =
       ((local_3e0.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_3d0.reader_.reader_.iter_._M_last =
       ((local_3e0.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_3d0.reader_.reader_.iter_._M_node =
       ((local_3e0.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_3d0.reader_.reader_.bytes_ = (local_3e0.pimpl_.px)->size_;
  local_3d0.reader_.reader_.chunkPos_ = 0;
  local_3d0.reader_.reader_.bytesRemaining_ = local_3d0.reader_.reader_.bytes_;
  boost::detail::shared_count::~shared_count(&local_3e0.pimpl_.pn);
  readData<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>(this,&local_3d0);
  boost::detail::shared_count::~shared_count(&local_3d0.reader_.reader_.bufferImpl_.pn);
  local_378._0_8_ = avro::ostream::vtable + 0x18;
  local_320[0] = 0x1d9dd8;
  local_378._8_8_ = &PTR__ostreambuf_001d9e60;
  boost::detail::shared_count::~shared_count(&local_330.pimpl_.pn);
  local_378._8_8_ = sysconf;
  std::locale::~locale(local_338);
  std::ios_base::~ios_base((ios_base *)local_320);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void readRawData() {
        std::ifstream in("test.avro");
        ostream os;
        os << in.rdbuf();
        Parser<Reader> p(os.getBuffer());
        readData(p);
    }